

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tensor.h
# Opt level: O1

void __thiscall shift_window_transformer::Tensor<float>::~Tensor(Tensor<float> *this)

{
  pointer piVar1;
  pointer pfVar2;
  
  piVar1 = (this->shape).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar1 != (pointer)0x0) {
    operator_delete(piVar1,(long)(this->shape).super__Vector_base<int,_std::allocator<int>_>._M_impl
                                 .super__Vector_impl_data._M_end_of_storage - (long)piVar1);
  }
  pfVar2 = (this->super_vector<float,_std::allocator<float>_>).
           super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
           _M_start;
  if (pfVar2 != (pointer)0x0) {
    operator_delete(pfVar2,(long)(this->super_vector<float,_std::allocator<float>_>).
                                 super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)pfVar2);
    return;
  }
  return;
}

Assistant:

Tensor() : std::vector<T>() {
        }